

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

ON_Texture * __thiscall ON_Texture::Duplicate(ON_Texture *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*(this->super_ON_Object)._vptr_ON_Object[2])();
  return (ON_Texture *)CONCAT44(extraout_var,iVar1);
}

Assistant:

bool ON_Texture::IsValid( ON_TextLog* text_log ) const
{
  if ( ON_Texture::TYPE::no_texture_type == m_type )
  {
    if ( text_log )
    {
      text_log->Print("ON_Texture m_type has invalid value.\n");
    }
    return false;
  }

  // TODO ...

  return true;
}